

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void show_shifts(void)

{
  uint uVar1;
  ulong uVar2;
  shifts **ppsVar3;
  uint uVar4;
  
  ppsVar3 = &first_shift;
  uVar4 = 0;
  while (ppsVar3 = &((shifts *)ppsVar3)->next->next, (shifts *)ppsVar3 != (shifts *)0x0) {
    if (uVar4 != 0) {
      putchar(10);
    }
    printf("shift %d, number = %d, nshifts = %d\n",(ulong)uVar4,
           (ulong)(uint)((shifts *)ppsVar3)->number,(ulong)(uint)((shifts *)ppsVar3)->nshifts);
    uVar1 = ((shifts *)ppsVar3)->nshifts;
    if (((shifts *)ppsVar3)->nshifts < 1) {
      uVar1 = 0;
    }
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      printf("\t%d\n",(ulong)(uint)((shifts *)ppsVar3)->shift[uVar2]);
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void show_shifts()
{
    shifts *p;
    int i, j, k;

    k = 0;
    for (p = first_shift; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("shift %d, number = %d, nshifts = %d\n", k, p->number,
		p->nshifts);
	j = p->nshifts;
	for (i = 0; i < j; ++i)
	    printf("\t%d\n", p->shift[i]);
    }
}